

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall c4::yml::Parser::_grow_filter_arena(Parser *this,size_t num_characters_needed)

{
  code *pcVar1;
  bool bVar2;
  error_flags eVar3;
  ulong in_RSI;
  long in_RDI;
  char msg [44];
  size_t sz;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  char *in_stack_ffffffffffffff58;
  Location *in_stack_ffffffffffffff60;
  ulong local_88;
  ulong local_80;
  undefined1 local_48 [32];
  size_t in_stack_ffffffffffffffd8;
  Parser *in_stack_ffffffffffffffe0;
  
  if (*(ulong *)(in_RDI + 0xa80) < in_RSI) {
    local_80 = *(long *)(in_RDI + 0xa80) << 1;
    if (local_80 < in_RSI) {
      local_80 = in_RSI;
    }
    if (local_80 < 0x80) {
      local_88 = 0x80;
    }
    else {
      local_88 = local_80;
    }
    if (local_88 < in_RSI) {
      memcpy(local_48,"check failed: (sz >= num_characters_needed)",0x2c);
      eVar3 = get_error_flags();
      if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
        trap_instruction();
      }
      pcVar1 = *(code **)(in_RDI + 0x9e8);
      Location::Location(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                         CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                         CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                         CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
      (*pcVar1)(local_48,0x2c,*(undefined8 *)(in_RDI + 0x9d0));
    }
    _resize_filter_arena(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

void Parser::_grow_filter_arena(size_t num_characters_needed)
{
    _c4dbgpf("grow: arena={} numchars={}", m_filter_arena.len, num_characters_needed);
    if(num_characters_needed <= m_filter_arena.len)
        return;
    size_t sz = m_filter_arena.len << 1;
    _c4dbgpf("grow: sz={}", sz);
    sz = num_characters_needed > sz ? num_characters_needed : sz;
    _c4dbgpf("grow: sz={}", sz);
    sz = sz < 128u ? 128u : sz;
    _c4dbgpf("grow: sz={}", sz);
    _RYML_CB_ASSERT(m_stack.m_callbacks, sz >= num_characters_needed);
    _resize_filter_arena(sz);
}